

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int identify_pack(int id_limit)

{
  boolean bVar1;
  int local_28;
  int local_24;
  int num_identified;
  int unid_cnt;
  obj *the_obj;
  obj *obj;
  int id_limit_local;
  
  local_28 = 0;
  local_24 = 0;
  _num_identified = (obj *)0x0;
  for (the_obj = invent; the_obj != (obj *)0x0; the_obj = the_obj->nobj) {
    bVar1 = not_fully_identified(the_obj);
    if (bVar1 != '\0') {
      local_24 = local_24 + 1;
      _num_identified = the_obj;
    }
  }
  if (local_24 == 0) {
    pline("You have already identified all of your possessions.");
  }
  else if (id_limit == 0) {
    if (local_24 == 1) {
      identify(_num_identified);
      local_28 = 1;
    }
    else {
      for (the_obj = invent; the_obj != (obj *)0x0; the_obj = the_obj->nobj) {
        bVar1 = not_fully_identified(the_obj);
        if (bVar1 != '\0') {
          identify(the_obj);
          local_28 = local_28 + 1;
        }
      }
    }
  }
  else {
    local_28 = menu_identify(id_limit);
  }
  update_inventory();
  return local_28;
}

Assistant:

int identify_pack(int id_limit)
{
    struct obj *obj, *the_obj;
    int unid_cnt;
    int num_identified = 0;

    unid_cnt = 0;
    the_obj = 0;		/* if unid_cnt ends up 1, this will be it */
    for (obj = invent; obj; obj = obj->nobj)
	if (not_fully_identified(obj)) ++unid_cnt, the_obj = obj;

    if (!unid_cnt) {
	pline("You have already identified all of your possessions.");
    } else if (!id_limit) {
	/* identify everything */
	if (unid_cnt == 1) {
	    identify(the_obj);
	    num_identified = 1;
	} else {
	    /* TODO:  use fully_identify_obj and cornline/menu/whatever here */
	    for (obj = invent; obj; obj = obj->nobj) {
		if (not_fully_identified(obj)) {
		    identify(obj);
		    num_identified++;
		}
	    }
	}
    } else {
	/* identify up to `id_limit' items */
	num_identified = menu_identify(id_limit);
    }
    update_inventory();

    return num_identified;
}